

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# person_builder.hpp
# Opt level: O2

void __thiscall PersonBuilder::PersonBuilder(PersonBuilder *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__s;
  Person local_c0;
  
  __s = &local_c0.street_address.field_2;
  memset(__s,0,0x98);
  local_c0.street_address._M_string_length = 0;
  local_c0.post_code._M_dataplus._M_p = (pointer)&local_c0.post_code.field_2;
  local_c0.post_code.field_2._M_local_buf[0] = '\0';
  local_c0.city._M_dataplus._M_p = (pointer)&local_c0.city.field_2;
  local_c0.city.field_2._M_local_buf[0] = '\0';
  local_c0.company_name._M_dataplus._M_p = (pointer)&local_c0.company_name.field_2;
  local_c0.company_name.field_2._M_local_buf[0] = '\0';
  local_c0.position._M_dataplus._M_p = (pointer)&local_c0.position.field_2;
  local_c0.position.field_2._M_local_buf[0] = '\0';
  local_c0.street_address._M_dataplus._M_p = (pointer)__s;
  std::optional<Person>::optional<Person,_true>(&this->person,&local_c0);
  Person::~Person(&local_c0);
  this->person_reference = (Person *)this;
  return;
}

Assistant:

PersonBuilder()
		:	person{Person()},
			person_reference{*person}
	{}